

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

int cymric_seed(cymric_rng *R,void *seed,int bytes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  time_t tVar5;
  uint32_t *t0;
  timezone cateq_z;
  uint8_t scratch_buff [48];
  timeval cateq_v;
  blake2b_state state;
  uint8_t *local_250;
  timezone local_248 [3];
  undefined8 local_230;
  timeval local_210;
  blake2b_state local_200;
  
  if (R == (cymric_rng *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = -2;
    if (m_is_initialized) {
      local_250 = (uint8_t *)&local_230;
      iVar1 = blake2b_init_key(&local_200,'@',R,'@');
      iVar2 = -3;
      if (iVar1 == 0) {
        if ((0 < bytes && seed != (void *)0x0) &&
           (iVar2 = blake2b_update(&local_200,(uint8_t *)seed,(ulong)(uint)bytes), iVar2 != 0)) {
          return -4;
        }
        gettimeofday(&local_210,local_248);
        iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,4);
        iVar2 = -5;
        if (iVar1 == 0) {
          uVar3 = read_file("/dev/random",(uint8_t *)&local_230,0x14);
          iVar1 = read_file("/dev/urandom",(uint8_t *)((long)&local_230 + (ulong)uVar3),0x20 - uVar3
                           );
          iVar2 = -6;
          if ((int)(0x20 - uVar3) <= iVar1) {
            iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,0x20);
            iVar2 = -7;
            if (iVar1 == 0) {
              local_230._0_4_ = getpid();
              iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,4);
              iVar2 = -0xe;
              if (iVar1 == 0) {
                lVar4 = syscall(0xba);
                local_230 = CONCAT44(local_230._4_4_,(int)lVar4);
                iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,4);
                iVar2 = -0xf;
                if (iVar1 == 0) {
                  gettimeofday(&local_210,local_248);
                  local_230 = local_210.tv_sec * 1000000 +
                              CONCAT44(local_210.tv_usec._4_4_,(undefined4)local_210.tv_usec);
                  iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,8);
                  iVar2 = -0x12;
                  if (iVar1 == 0) {
                    uVar3 = rand();
                    tVar5 = time((time_t *)0x0);
                    srand(uVar3 ^ (uint)tVar5);
                    iVar2 = rand();
                    local_230 = CONCAT44(local_230._4_4_,iVar2);
                    iVar2 = rand();
                    local_230._4_4_ = iVar2;
                    iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,8);
                    iVar2 = -0x14;
                    if (iVar1 == 0) {
                      gettimeofday(&local_210,local_248);
                      iVar1 = blake2b_update(&local_200,(uint8_t *)&local_230,4);
                      iVar2 = -0x15;
                      if (iVar1 == 0) {
                        LOCK();
                        UNLOCK();
                        local_230 = CONCAT44(local_230._4_4_,
                                             (int)m_counter.super___atomic_base<unsigned_int>._M_i +
                                             1);
                        m_counter.super___atomic_base<unsigned_int>._M_i =
                             (__atomic_base<unsigned_int>)
                             (__atomic_base<unsigned_int>)
                             (m_counter.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
                        iVar1 = blake2b_update(&local_200,local_250,4);
                        iVar2 = -0x16;
                        if (iVar1 == 0) {
                          iVar1 = blake2b_final(&local_200,(uint8_t *)R,'@');
                          iVar2 = -0x17;
                          if (iVar1 == 0) {
                            lVar4 = 0;
                            do {
                              local_200.buf[lVar4] = '\0';
                              lVar4 = lVar4 + 1;
                            } while (lVar4 != 0x100);
                            lVar4 = 0;
                            do {
                              *(undefined1 *)((long)&local_248[-1].tz_minuteswest + lVar4) = 0;
                              lVar4 = lVar4 + 1;
                            } while (lVar4 != 8);
                            iVar2 = 0;
                            builtin_strncpy(R->internal + 0x40,"SEED",4);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int cymric_seed(
    cymric_rng* R,      ///< [out] Generator to seed
    const void* seed,   ///< [in] Seed bytes to use
    int bytes           ///< [in] Number of seed bytes
) {
    // Self-test, verified to fail if set too high
    static const int MIN_ENTROPY = 425;
    int entropy = 0;

    // Align scratch space to 16 bytes
    static const unsigned kAlignmentBytes = 16;

    // Scratch space for loading entropy source bits
    uint8_t scratch_buff[kAlignmentBytes + SEED_SCRATCH_BYTES];

    // Align scratch to avoid alignment issues on mobile
    uint8_t* scratch = scratch_buff;
    scratch += kAlignmentBytes - ((uintptr_t)scratch % kAlignmentBytes);

    // Initialize BLAKE2 state for 512-bit output
    blake2b_state state;

    // If input is invalid:
    if (!R)
        return -1;

    // If not initialized yet:
    if (!m_is_initialized)
        return -2;

    // Mix in previous or uninitialized state
    if (blake2b_init_key(&state, 64, R->internal, 64))
        return -3;

    // Mix in the seed
    if (seed && bytes > 0) {
        if (blake2b_update(&state, (const uint8_t *)seed, bytes))
            return -4;
    }

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        uint32_t *t0 = (uint32_t *)scratch;
        *t0 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -5;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_DEV_RANDOM
    {
        // Mix in /dev/random.
        // This is a bit of a hack.  Most Linuxy systems "cache" about 20 bytes
        // for /dev/random.  Requesting 32 bytes may take up to a minute longer
        // and this would be really irritating for users of the library.  So
        // instead we grab just 20 bytes and then take the rest from urandom,
        // which is often implemented as a separate pool that will actually
        // provide additional entropy over /dev/random even when that device
        // is blocking waiting for more
        int devrand_bytes = read_file(CYMRIC_RAND_FILE, scratch, 20);

        // Fill in the rest with /dev/urandom
        int min_bytes = 32 - devrand_bytes;
        if (read_file(CYMRIC_URAND_FILE, scratch + devrand_bytes, min_bytes) < min_bytes)
            return -6;

        if (blake2b_update(&state, scratch, 32))
            return -7;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_WINCRYPT
    {
        // Mix in Windows cryptographic RNG
        HCRYPTPROV hCryptProv;
        if (!CryptAcquireContext(&hCryptProv, 0, 0, PROV_RSA_FULL, CRYPT_VERIFYCONTEXT|CRYPT_SILENT))
            return -8;
        if (hCryptProv && !CryptGenRandom(hCryptProv, 32, scratch))
            return -9;
        if (hCryptProv && !CryptReleaseContext(hCryptProv, 0))
            return -10;
        if (blake2b_update(&state, scratch, 32))
            return -11;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_ARC4RANDOM
    {
        // Mix in arc4random
        arc4random_buf(scratch, 32);
        if (blake2b_update(&state, scratch, 32))
            return -12;
        entropy += 256;
    }
#endif
    
#ifdef CYMRIC_WINMEM
    {
        // Mix in Windows memory info
        MEMORYSTATUS *mem_stats = (MEMORYSTATUS *)scratch;
        GlobalMemoryStatus(mem_stats);
        if (blake2b_update(&state, scratch, sizeof(MEMORYSTATUS)))
            return -13;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETPID
    {
        // Mix in process id
        uint32_t *pid = (uint32_t *)scratch;
        *pid = (uint32_t)getpid();
        if (blake2b_update(&state, scratch, 4))
            return -14;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        uint32_t *tid = (uint32_t *)scratch;
        *tid = unix_gettid();
        if (blake2b_update(&state, scratch, 4))
            return -15;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t *myself = (pthread_t *)scratch;
        *myself = pthread_self();
        if (blake2b_update(&state, scratch, sizeof(pthread_t)))
            return -16;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        uint32_t *wintid = (uint32_t *)scratch;
        *wintid = GetCurrentThreadId();
        if (blake2b_update(&state, scratch, 4))
            return -17;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_USEC
    {
        // Mix in microsecond clock
        uint64_t *s0 = (uint64_t *)scratch;
        *s0 = GetMicrosecondTimeCounter();
        if (blake2b_update(&state, scratch, sizeof(double)))
            return -18;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_SRANDOM
    {
        // Mix in srandom
        srandom(random() ^ time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = random();
        sr[1] = random();
        if (black2b_update(&state, scratch, 8))
            return -19;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_SRAND
    {
        // Mix in srand
        srand(rand() ^ (unsigned int)time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = rand();
        sr[1] = rand();
        if (blake2b_update(&state, scratch, 8))
            return -20;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        uint32_t *t1 = (uint32_t *)scratch;
        *t1 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -21;
        entropy += 9;
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        uint32_t *c0 = (uint32_t *)scratch;
        *c0 = get_counter();
        if (blake2b_update(&state, scratch, 4))
            return -22;
        entropy += 1;
    }
#endif

    // Squeeze out 512 random bits from entropy sources
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -23;

    // Erase BLAKE2 state and scratch
    CAT_SECURE_OBJCLR(state.buf);
    CAT_SECURE_OBJCLR(scratch);

    // Sanity check for compilation
    if (entropy < MIN_ENTROPY)
        return -24;

    // Indicate state is seeded
    R->internal[64] = 'S';
    R->internal[65] = 'E';
    R->internal[66] = 'E';
    R->internal[67] = 'D';

    return 0;
}